

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_output_chain.c
# Opt level: O1

ngx_int_t ngx_output_chain(ngx_output_chain_ctx_t *ctx,ngx_chain_t *in)

{
  ngx_chain_t **ppnVar1;
  ngx_chain_t *pnVar2;
  ngx_log_t *pnVar3;
  ngx_file_t *pnVar4;
  ngx_pool_t *pnVar5;
  ngx_chain_t **ppnVar6;
  ngx_chain_t *pnVar7;
  byte bVar8;
  ushort uVar9;
  ushort uVar10;
  ngx_buf_t *pnVar11;
  ngx_chain_t *pnVar12;
  ngx_buf_t *pnVar13;
  u_char *puVar14;
  ngx_output_chain_filter_pt UNRECOVERED_JUMPTABLE;
  ngx_int_t nVar15;
  long lVar16;
  ulong uVar17;
  byte bVar18;
  size_t sVar19;
  ngx_output_chain_ctx_t *pnVar20;
  ngx_buf_t *pnVar21;
  ngx_buf_t *pnVar22;
  void *pvVar23;
  ushort uVar24;
  ngx_output_chain_ctx_t *pnVar25;
  ngx_chain_t **ppnVar26;
  ulong uVar27;
  ulong uVar28;
  size_t size;
  bool bVar29;
  long local_58;
  ngx_buf_t *local_48;
  ngx_chain_t *out;
  ngx_output_chain_ctx_t *local_38;
  
  bVar8 = 0;
  if ((ctx->in != (ngx_chain_t *)0x0) || (ctx->busy != (ngx_chain_t *)0x0)) goto LAB_00115f76;
  if (in != (ngx_chain_t *)0x0) {
    if (in->next == (ngx_chain_t *)0x0) {
      pnVar13 = in->buf;
      uVar24 = *(ushort *)&pnVar13->field_0x48;
      if (((uVar24 & 0x10) == 0) || (pnVar13->file_last < 0x80000001)) {
        if ((uVar24 & 0xe0) == 0 || (uVar24 & 0x17) != 0) {
          if (((uVar24 & 0x10) != 0) && ((pnVar13->file->field_0xc0 & 2) != 0)) goto LAB_00115f76;
          bVar18 = ctx->field_0x20 & 1;
          if ((uVar24 & 0x10) != 0) {
            bVar18 = ctx->field_0x20 & 1;
            if (0x7fffffff < pnVar13->file_pos) {
              bVar18 = 0;
            }
          }
          if (bVar18 == 0) {
            if ((uVar24 & 7) == 0) goto LAB_00115f76;
            *(ushort *)&pnVar13->field_0x48 = uVar24 & 0xffef;
          }
          if ((((ctx->field_0x20 & 8) != 0) && ((pnVar13->field_0x48 & 7) == 0)) ||
             (((ctx->field_0x20 & 0x10) != 0 && ((pnVar13->field_0x48 & 6) != 0))))
          goto LAB_00115f76;
        }
        UNRECOVERED_JUMPTABLE = ctx->output_filter;
        pvVar23 = ctx->filter_ctx;
        goto LAB_0011670e;
      }
    }
LAB_00115f76:
    ppnVar1 = &ctx->in;
    local_38 = ctx;
    if (in != (ngx_chain_t *)0x0) {
      out = (ngx_chain_t *)ctx->pool;
      ppnVar6 = ppnVar1;
      do {
        ppnVar26 = ppnVar6;
        ppnVar6 = &(*ppnVar26)->next;
      } while (*ppnVar26 != (ngx_chain_t *)0x0);
      do {
        pnVar12 = ngx_alloc_chain_link((ngx_pool_t *)out);
        if (pnVar12 == (ngx_chain_t *)0x0) {
          return -1;
        }
        pnVar13 = in->buf;
        if ((((pnVar13->field_0x48 & 0x10) == 0) || (0x7fffffff < pnVar13->file_pos)) ||
           (pnVar13->file_last < 0x80000001)) {
          pnVar12->buf = pnVar13;
          in = in->next;
        }
        else {
          pnVar11 = (ngx_buf_t *)ngx_pcalloc((ngx_pool_t *)out,0x50);
          if (pnVar11 == (ngx_buf_t *)0x0) {
            return -1;
          }
          pnVar21 = pnVar13;
          pnVar22 = pnVar11;
          for (lVar16 = 10; lVar16 != 0; lVar16 = lVar16 + -1) {
            pnVar22->pos = pnVar21->pos;
            pnVar21 = (ngx_buf_t *)((long)pnVar21 + ((ulong)bVar8 * -2 + 1) * 8);
            pnVar22 = (ngx_buf_t *)((long)pnVar22 + ((ulong)bVar8 * -2 + 1) * 8);
          }
          if ((pnVar13->field_0x48 & 7) != 0) {
            puVar14 = pnVar13->pos;
            pnVar13->pos = puVar14 + (0x80000000 - pnVar13->file_pos);
            pnVar11->last = puVar14 + (0x80000000 - pnVar13->file_pos);
          }
          pnVar13->file_pos = 0x80000000;
          pnVar11->file_last = 0x80000000;
          pnVar12->buf = pnVar11;
        }
        pnVar12->next = (ngx_chain_t *)0x0;
        *ppnVar26 = pnVar12;
        ppnVar26 = &pnVar12->next;
      } while (in != (ngx_chain_t *)0x0);
    }
    local_48 = (ngx_buf_t *)0x0;
    ppnVar6 = &local_38->free;
    ppnVar26 = &local_38->busy;
    local_58 = 1;
    pnVar25 = local_38;
    do {
      pnVar2 = *ppnVar1;
      pnVar7 = (ngx_chain_t *)&stack0xffffffffffffffb8;
      pnVar12 = out;
      while (out = pnVar7, pnVar2 != (ngx_chain_t *)0x0) {
        pnVar13 = pnVar2->buf;
        uVar24 = *(ushort *)&pnVar13->field_0x48;
        if ((uVar24 & 7) == 0) {
          uVar27 = pnVar13->file_last - pnVar13->file_pos;
        }
        else {
          uVar27 = (long)pnVar13->last - (long)pnVar13->pos;
        }
        if ((uVar27 == 0) && ((uVar24 & 0xe0) == 0 || (uVar24 & 0x17) != 0)) {
          pnVar3 = pnVar25->pool->log;
          if (1 < pnVar3->log_level) {
            ngx_log_error_core(2,pnVar3,0,"zero size buf in output t:%d r:%d f:%d %p %p-%p %p %O-%O"
                               ,(ulong)(uVar24 & 1),(ulong)(uVar24 >> 3 & 1),
                               (ulong)(uVar24 >> 4 & 1),pnVar13->start,pnVar13->pos,pnVar13->last,
                               pnVar13->file,pnVar13->file_pos,pnVar13->file_last);
          }
          ngx_debug_point();
          pnVar2 = (*ppnVar1)->next;
          *ppnVar1 = pnVar2;
          pnVar7 = out;
          pnVar12 = out;
        }
        else {
          if ((uVar24 & 0xe0) == 0 || (uVar24 & 0x17) != 0) {
            if (((uVar24 & 0x10) == 0) || ((pnVar13->file->field_0xc0 & 2) == 0)) {
              bVar8 = pnVar25->field_0x20 & 1;
              if (((uVar24 & 0x10) != 0) && (0x7fffffff < pnVar13->file_pos)) {
                bVar8 = 0;
              }
              if (bVar8 == 0) {
                if ((uVar24 & 7) == 0) goto LAB_001161cf;
                *(ushort *)&pnVar13->field_0x48 = uVar24 & 0xffef;
              }
              if ((((pnVar25->field_0x20 & 8) == 0) || ((pnVar13->field_0x48 & 7) != 0)) &&
                 (((pnVar25->field_0x20 & 0x10) == 0 || ((pnVar13->field_0x48 & 6) == 0))))
              goto LAB_00116218;
            }
LAB_001161cf:
            if (pnVar25->buf == (ngx_buf_t *)0x0) {
              pnVar13 = (*ppnVar1)->buf;
              pnVar4 = pnVar13->file;
              lVar16 = -5;
              if ((pnVar4 != (ngx_file_t *)0x0) && ((pnVar4->field_0xc0 & 2) != 0)) {
                pnVar25->field_0x20 = pnVar25->field_0x20 | 2;
                uVar17 = pnVar25->alignment - 1U & pnVar13->file_pos;
                if (uVar17 == 0) {
                  uVar17 = uVar27;
                  if ((long)(pnVar25->bufs).size <= (long)uVar27) goto LAB_00116250;
                }
                else {
                  uVar17 = pnVar25->alignment - uVar17;
                  if ((long)uVar27 <= (long)uVar17) {
                    uVar17 = uVar27;
                  }
                }
                pnVar13 = ngx_create_temp_buf(pnVar25->pool,uVar17);
                pnVar25->buf = pnVar13;
                lVar16 = -(ulong)(pnVar13 == (ngx_buf_t *)0x0);
              }
LAB_00116250:
              pnVar20 = local_38;
              if (lVar16 != 0) {
                if (lVar16 == -1) {
                  return -1;
                }
                pnVar12 = local_38->free;
                pnVar25 = local_38;
                if (pnVar12 == (ngx_chain_t *)0x0) {
                  pnVar12 = out;
                  if ((local_48 != (ngx_buf_t *)0x0) ||
                     (lVar16 = (local_38->bufs).num, local_38->allocated == lVar16)) break;
                  uVar17 = (local_38->bufs).size;
                  uVar24 = 8;
                  if ((local_38->in->buf->field_0x49 & 1) != 0) {
                    if ((long)uVar27 < (long)uVar17) {
                      uVar24 = 0;
                      uVar17 = uVar27;
                    }
                    else if ((lVar16 == 1) && ((local_38->field_0x20 & 2) == 0)) {
                      lVar16 = (uVar17 >> 2) + uVar17;
                      uVar28 = uVar27;
                      if (lVar16 <= (long)uVar27) {
                        uVar28 = uVar17;
                      }
                      uVar24 = (ushort)(lVar16 <= (long)uVar27) << 3;
                      uVar17 = uVar28;
                    }
                  }
                  pnVar13 = (ngx_buf_t *)ngx_pcalloc(local_38->pool,0x50);
                  if (pnVar13 == (ngx_buf_t *)0x0) {
                    return -1;
                  }
                  if ((pnVar20->field_0x20 & 2) == 0) {
                    puVar14 = (u_char *)ngx_palloc(pnVar20->pool,uVar17);
                  }
                  else {
                    puVar14 = (u_char *)ngx_pmemalign(pnVar20->pool,uVar17,pnVar20->alignment);
                  }
                  pnVar13->start = puVar14;
                  if (puVar14 == (u_char *)0x0) {
                    return -1;
                  }
                  pnVar11 = (ngx_buf_t *)pnVar13->start;
                  pnVar13->pos = (u_char *)pnVar11;
                  pnVar13->last = (u_char *)pnVar11;
                  pnVar13->end = (u_char *)((long)&pnVar11->pos + uVar17);
                  uVar9 = (ushort)*(undefined4 *)&pnVar13->field_0x48;
                  *(ushort *)&pnVar13->field_0x48 = uVar9 | 1;
                  pnVar13->tag = local_38->tag;
                  *(ushort *)&pnVar13->field_0x48 = uVar24 | uVar9 & 0xfff7 | 1;
                  local_38->buf = pnVar13;
                  local_38->allocated = local_38->allocated + 1;
                  pnVar25 = local_38;
                }
                else {
                  local_38->buf = pnVar12->buf;
                  local_38->free = pnVar12->next;
                  pnVar5 = local_38->pool;
                  pnVar12->next = pnVar5->chain;
                  pnVar5->chain = pnVar12;
                }
              }
            }
            pnVar13 = pnVar25->buf;
            pnVar11 = pnVar25->in->buf;
            uVar24 = *(ushort *)&pnVar11->field_0x48;
            if ((uVar24 & 7) == 0) {
              sVar19 = pnVar11->file_last - pnVar11->file_pos;
            }
            else {
              sVar19 = (long)pnVar11->last - (long)pnVar11->pos;
            }
            pnVar21 = (ngx_buf_t *)pnVar13->pos;
            size = (long)pnVar13->end - (long)pnVar21;
            if ((long)sVar19 < (long)size) {
              size = sVar19;
            }
            bVar29 = (pnVar25->field_0x20 & 3) == 1;
            if (((uVar24 & 0x10) != 0) && (0x7fffffff < pnVar11->file_pos)) {
              bVar29 = false;
            }
            if ((uVar24 & 7) == 0) {
              sVar19 = ngx_read_file(pnVar11->file,(u_char *)pnVar21,size,pnVar11->file_pos);
              if (sVar19 == 0xffffffffffffffff) {
                return -1;
              }
              if (sVar19 != size) {
                pnVar3 = local_38->pool->log;
                if (pnVar3->log_level < 2) {
                  return -1;
                }
                ngx_log_error_core(2,pnVar3,0,"pread() read only %z of %O from \"%s\"",sVar19,size,
                                   (pnVar11->file->name).data);
                return -1;
              }
              pnVar13->last = (u_char *)((long)&((ngx_chain_t *)pnVar13->last)->buf + sVar19);
              if (bVar29) {
                *(ushort *)&pnVar13->field_0x48 = *(ushort *)&pnVar13->field_0x48 | 0x10;
                pnVar13->file = pnVar11->file;
                pnVar13->file_pos = pnVar11->file_pos;
                pnVar13->file_last = pnVar11->file_pos + sVar19;
              }
              else {
                *(ushort *)&pnVar13->field_0x48 = *(ushort *)&pnVar13->field_0x48 & 0xffef;
              }
              lVar16 = pnVar11->file_pos + sVar19;
              pnVar11->file_pos = lVar16;
              if (lVar16 == pnVar11->file_last) goto LAB_0011650b;
            }
            else {
              memcpy(pnVar21,pnVar11->pos,size);
              pnVar11->pos = pnVar11->pos + size;
              pnVar13->last = (u_char *)((long)&((ngx_chain_t *)pnVar13->last)->buf + size);
              if ((pnVar11->field_0x48 & 0x10) == 0) {
                pnVar13->field_0x48 = pnVar13->field_0x48 & 0xef;
              }
              else {
                if (bVar29) {
                  *(ushort *)&pnVar13->field_0x48 = *(ushort *)&pnVar13->field_0x48 | 0x10;
                  pnVar13->file = pnVar11->file;
                  pnVar13->file_pos = pnVar11->file_pos;
                  pnVar13->file_last = pnVar11->file_pos + size;
                }
                else {
                  *(ushort *)&pnVar13->field_0x48 = *(ushort *)&pnVar13->field_0x48 & 0xffef;
                }
                pnVar11->file_pos = pnVar11->file_pos + size;
              }
              if (pnVar11->pos == pnVar11->last) {
LAB_0011650b:
                uVar9 = *(ushort *)&pnVar11->field_0x48 & 0x20;
                uVar24 = (ushort)*(undefined4 *)&pnVar13->field_0x48;
                *(ushort *)&pnVar13->field_0x48 = uVar24 & 0xffdf | uVar9;
                uVar10 = *(ushort *)&pnVar11->field_0x48 & 0x80;
                *(ushort *)&pnVar13->field_0x48 = uVar24 & 0xff5f | uVar9 | uVar10;
                *(ushort *)&pnVar13->field_0x48 =
                     uVar24 & 0xfe5f | uVar9 | uVar10 | *(ushort *)&pnVar11->field_0x48 & 0x100;
              }
            }
            pnVar25 = local_38;
            pnVar13 = (*ppnVar1)->buf;
            if ((pnVar13->field_0x48 & 7) == 0) {
              lVar16 = pnVar13->file_last - pnVar13->file_pos;
            }
            else {
              lVar16 = (long)pnVar13->last - (long)pnVar13->pos;
            }
            if (lVar16 == 0) {
              *ppnVar1 = (*ppnVar1)->next;
            }
            pnVar13 = (ngx_buf_t *)ngx_alloc_chain_link(local_38->pool);
            if (pnVar13 == (ngx_buf_t *)0x0) {
              return -1;
            }
            pnVar13->pos = (u_char *)pnVar25->buf;
            pnVar12 = (ngx_chain_t *)&pnVar13->last;
            pnVar13->last = (u_char *)0x0;
            pnVar20 = pnVar25;
          }
          else {
LAB_00116218:
            pnVar13 = (ngx_buf_t *)*ppnVar1;
            pnVar12 = (ngx_chain_t *)&pnVar13->last;
            *ppnVar1 = (ngx_chain_t *)pnVar13->last;
            pnVar20 = (ngx_output_chain_ctx_t *)pnVar12;
          }
          out->buf = pnVar13;
          pnVar20->buf = (ngx_buf_t *)0x0;
          pnVar2 = pnVar25->in;
          pnVar7 = pnVar12;
        }
      }
      out = pnVar12;
      if (local_58 != 1 && local_48 == (ngx_buf_t *)0x0) {
        nVar15 = -2;
        if (*ppnVar1 == (ngx_chain_t *)0x0) {
          nVar15 = local_58;
        }
        return nVar15;
      }
      local_58 = (*pnVar25->output_filter)(pnVar25->filter_ctx,(ngx_chain_t *)local_48);
      if (local_58 == -4) {
        return -4;
      }
      if (local_58 == -1) {
        return -1;
      }
      ngx_chain_update_chains
                (pnVar25->pool,ppnVar6,ppnVar26,(ngx_chain_t **)&stack0xffffffffffffffb8,
                 pnVar25->tag);
    } while( true );
  }
  UNRECOVERED_JUMPTABLE = ctx->output_filter;
  pvVar23 = ctx->filter_ctx;
  in = (ngx_chain_t *)0x0;
LAB_0011670e:
  nVar15 = (*UNRECOVERED_JUMPTABLE)(pvVar23,in);
  return nVar15;
}

Assistant:

ngx_int_t
ngx_output_chain(ngx_output_chain_ctx_t *ctx, ngx_chain_t *in)
{
    off_t         bsize;
    ngx_int_t     rc, last;
    ngx_chain_t  *cl, *out, **last_out;

    if (ctx->in == NULL && ctx->busy == NULL
#if (NGX_HAVE_FILE_AIO || NGX_THREADS)
        && !ctx->aio
#endif
       )
    {
        /*
         * the short path for the case when the ctx->in and ctx->busy chains
         * are empty, the incoming chain is empty too or has the single buf
         * that does not require the copy
         */

        if (in == NULL) {
            return ctx->output_filter(ctx->filter_ctx, in);
        }

        if (in->next == NULL
#if (NGX_SENDFILE_LIMIT)
            && !(in->buf->in_file && in->buf->file_last > NGX_SENDFILE_LIMIT)
#endif
            && ngx_output_chain_as_is(ctx, in->buf))
        {
            return ctx->output_filter(ctx->filter_ctx, in);
        }
    }

    /* add the incoming buf to the chain ctx->in */

    if (in) {
        if (ngx_output_chain_add_copy(ctx->pool, &ctx->in, in) == NGX_ERROR) {
            return NGX_ERROR;
        }
    }

    out = NULL;
    last_out = &out;
    last = NGX_NONE;

    for ( ;; ) {

#if (NGX_HAVE_FILE_AIO || NGX_THREADS)
        if (ctx->aio) {
            return NGX_AGAIN;
        }
#endif

        while (ctx->in) {

            /*
             * cycle while there are the ctx->in bufs
             * and there are the free output bufs to copy in
             */

            bsize = ngx_buf_size(ctx->in->buf);

            if (bsize == 0 && !ngx_buf_special(ctx->in->buf)) {

                ngx_log_error(NGX_LOG_ALERT, ctx->pool->log, 0,
                              "zero size buf in output "
                              "t:%d r:%d f:%d %p %p-%p %p %O-%O",
                              ctx->in->buf->temporary,
                              ctx->in->buf->recycled,
                              ctx->in->buf->in_file,
                              ctx->in->buf->start,
                              ctx->in->buf->pos,
                              ctx->in->buf->last,
                              ctx->in->buf->file,
                              ctx->in->buf->file_pos,
                              ctx->in->buf->file_last);

                ngx_debug_point();

                ctx->in = ctx->in->next;

                continue;
            }

            if (ngx_output_chain_as_is(ctx, ctx->in->buf)) {

                /* move the chain link to the output chain */

                cl = ctx->in;
                ctx->in = cl->next;

                *last_out = cl;
                last_out = &cl->next;
                cl->next = NULL;

                continue;
            }

            if (ctx->buf == NULL) {

                rc = ngx_output_chain_align_file_buf(ctx, bsize);

                if (rc == NGX_ERROR) {
                    return NGX_ERROR;
                }

                if (rc != NGX_OK) {

                    if (ctx->free) {

                        /* get the free buf */

                        cl = ctx->free;
                        ctx->buf = cl->buf;
                        ctx->free = cl->next;

                        ngx_free_chain(ctx->pool, cl);

                    } else if (out || ctx->allocated == ctx->bufs.num) {

                        break;

                    } else if (ngx_output_chain_get_buf(ctx, bsize) != NGX_OK) {
                        return NGX_ERROR;
                    }
                }
            }

            rc = ngx_output_chain_copy_buf(ctx);

            if (rc == NGX_ERROR) {
                return rc;
            }

            if (rc == NGX_AGAIN) {
                if (out) {
                    break;
                }

                return rc;
            }

            /* delete the completed buf from the ctx->in chain */

            if (ngx_buf_size(ctx->in->buf) == 0) {
                ctx->in = ctx->in->next;
            }

            cl = ngx_alloc_chain_link(ctx->pool);
            if (cl == NULL) {
                return NGX_ERROR;
            }

            cl->buf = ctx->buf;
            cl->next = NULL;
            *last_out = cl;
            last_out = &cl->next;
            ctx->buf = NULL;
        }

        if (out == NULL && last != NGX_NONE) {

            if (ctx->in) {
                return NGX_AGAIN;
            }

            return last;
        }

        last = ctx->output_filter(ctx->filter_ctx, out);

        if (last == NGX_ERROR || last == NGX_DONE) {
            return last;
        }

        ngx_chain_update_chains(ctx->pool, &ctx->free, &ctx->busy, &out,
                                ctx->tag);
        last_out = &out;
    }
}